

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void Centaurus::DFARoutineEM64T<unsigned_char>::emit
               (X86Assembler *as,Label *rejectlabel,DFA<unsigned_char> *dfa,MyConstPool *pool)

{
  long lVar1;
  long lVar2;
  int i_1;
  int i;
  int iVar3;
  long lVar4;
  long lVar5;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  Label finishlabel;
  
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar3 = 0;
      lVar1 = (long)(dfa->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(dfa->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, iVar3 < (int)(lVar1 / 0x48);
      iVar3 = iVar3 + 1) {
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&finishlabel,as);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::emplace_back<asmjit::Label>
              (&statelabels,&finishlabel);
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&finishlabel,as,lVar1 % 0x48);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4b0),0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x11e,
             (Operand_ *)
             statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_start);
  lVar5 = 0;
  lVar4 = 0;
  for (lVar1 = 0;
      lVar2 = (long)(dfa->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(dfa->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar1 < (int)(lVar2 / 0x48);
      lVar1 = lVar1 + 1) {
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
              (as,(long)&((statelabels.
                           super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl
                           .super__Vector_impl_data._M_start)->super_Operand).super_Operand_.field_0
                  + lVar5);
    emit_state(as,&finishlabel,
               (DFAState<unsigned_char> *)
               ((long)&(((dfa->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                         super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_NFABaseState<unsigned_char,_Centaurus::IndexVector>)._vptr_NFABaseState
               + lVar4),(int)lVar1,&statelabels,pool);
    lVar4 = lVar4 + 0x48;
    lVar5 = lVar5 + 0x10;
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&finishlabel,lVar2 % 0x48);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
             (Operand_ *)(asmjit::x86OpData + 0x4b0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x4e0),0);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x132,(Operand_ *)rejectlabel);
  std::_Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>::~_Vector_base
            (&statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFA<TCHAR>& dfa, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < dfa.get_state_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    asmjit::Label finishlabel = as.newLabel();

    as.mov(BACKUP_REG, 0);
    as.jmp(statelabels[0]);

    for (int i = 0; i < dfa.get_state_num(); i++)
    {
        as.bind(statelabels[i]);

        emit_state(as, finishlabel, dfa[i], i, statelabels, pool);
    }
    as.bind(finishlabel);
    as.mov(INPUT_REG, BACKUP_REG);
    as.cmp(INPUT_REG, 0);
    as.jz(rejectlabel);
}